

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

mat4 * dja::mat4::homogeneous::translation(mat4 *__return_storage_ptr__,vec3 *dir)

{
  vec3 *dir_local;
  
  mat4(__return_storage_ptr__,1.0,0.0,0.0,dir->x,0.0,1.0,0.0,dir->y,0.0,0.0,1.0,dir->z,0.0,0.0,0.0,
       1.0);
  return __return_storage_ptr__;
}

Assistant:

mat4 mat4::homogeneous::translation(const vec3& dir)
{
    return mat4(1, 0, 0, dir.x,
                0, 1, 0, dir.y,
                0, 0, 1, dir.z,
                0, 0, 0, 1     );
}